

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

int Sfm_DecMffcAreaReal(Abc_Obj_t *pPivot,Vec_Int_t *vCut,Vec_Int_t *vMffc)

{
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  int Area2;
  int Area1;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk;
  Vec_Int_t *vMffc_local;
  Vec_Int_t *vCut_local;
  Abc_Obj_t *pPivot_local;
  
  pNtk_00 = pPivot->pNtk;
  iVar1 = Abc_ObjIsNode(pPivot);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x2cf,"int Sfm_DecMffcAreaReal(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (vMffc != (Vec_Int_t *)0x0) {
    Vec_IntClear(vMffc);
  }
  for (Area2 = 0; iVar1 = Vec_IntSize(vCut), Area2 < iVar1; Area2 = Area2 + 1) {
    iVar1 = Vec_IntEntry(vCut,Area2);
    pAVar4 = Abc_NtkObj(pNtk_00,iVar1);
    if (pAVar4 != (Abc_Obj_t *)0x0) {
      (pAVar4->vFanouts).nSize = (pAVar4->vFanouts).nSize + 1;
    }
  }
  iVar1 = Sfm_MffcDeref_rec(pPivot);
  iVar2 = Sfm_MffcRef_rec(pPivot,vMffc);
  for (Area2 = 0; iVar3 = Vec_IntSize(vCut), Area2 < iVar3; Area2 = Area2 + 1) {
    iVar3 = Vec_IntEntry(vCut,Area2);
    pAVar4 = Abc_NtkObj(pNtk_00,iVar3);
    if (pAVar4 != (Abc_Obj_t *)0x0) {
      (pAVar4->vFanouts).nSize = (pAVar4->vFanouts).nSize + -1;
    }
  }
  if (iVar1 == iVar2) {
    return iVar1;
  }
  __assert_fail("Area1 == Area2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                ,0x2d8,"int Sfm_DecMffcAreaReal(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

int Sfm_DecMffcAreaReal( Abc_Obj_t * pPivot, Vec_Int_t * vCut, Vec_Int_t * vMffc )
{
    Abc_Ntk_t * pNtk = pPivot->pNtk;
    Abc_Obj_t * pObj; 
    int i, Area1, Area2;
    assert( Abc_ObjIsNode(pPivot) );
    if ( vMffc )
        Vec_IntClear( vMffc );
    Abc_NtkForEachObjVec( vCut, pNtk, pObj, i )
        pObj->vFanouts.nSize++;
    Area1 = Sfm_MffcDeref_rec( pPivot );
    Area2 = Sfm_MffcRef_rec( pPivot, vMffc );
    Abc_NtkForEachObjVec( vCut, pNtk, pObj, i )
        pObj->vFanouts.nSize--;
    assert( Area1 == Area2 );
    return Area1;
}